

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void close_frame_written(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  cio_websocket_write_job *pcVar1;
  cio_websocket_write_job *job;
  cio_websocket *websocket;
  cio_error err_local;
  void *handler_context_local;
  cio_buffered_stream *buffered_stream_local;
  
  pcVar1 = write_jobs_popfront((cio_websocket *)handler_context);
  abort_write_jobs((cio_websocket *)handler_context);
  if (pcVar1->handler != (cio_websocket_write_handler_t)0x0) {
    (*pcVar1->handler)((cio_websocket *)handler_context,pcVar1->handler_context,err);
  }
  return;
}

Assistant:

static void close_frame_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	const struct cio_websocket_write_job *job = write_jobs_popfront(websocket);

	abort_write_jobs(websocket);

	if (job->handler) {
		job->handler(websocket, job->handler_context, err);
	}
}